

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDbvt.h
# Opt level: O3

void __thiscall
btDbvt::collideTTpersistentStack(btDbvt *this,btDbvtNode *root0,btDbvtNode *root1,ICollide *policy)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  int iVar3;
  sStkNN *psVar4;
  btDbvtNode *pbVar5;
  btDbvtNode *pbVar6;
  btDbvtNode *pbVar7;
  undefined8 uVar8;
  sStkNN *psVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  
  if (root1 != (btDbvtNode *)0x0 && root0 != (btDbvtNode *)0x0) {
    if (((this->m_stkStack).m_size < 0x80) && ((this->m_stkStack).m_capacity < 0x80)) {
      psVar9 = (sStkNN *)btAlignedAllocInternal(0x800,0x10);
      lVar10 = (long)(this->m_stkStack).m_size;
      if (0 < lVar10) {
        lVar12 = 0;
        do {
          puVar1 = (undefined8 *)((long)&((this->m_stkStack).m_data)->a + lVar12);
          uVar8 = puVar1[1];
          puVar2 = (undefined8 *)((long)&psVar9->a + lVar12);
          *puVar2 = *puVar1;
          puVar2[1] = uVar8;
          lVar12 = lVar12 + 0x10;
        } while (lVar10 * 0x10 != lVar12);
      }
      psVar4 = (this->m_stkStack).m_data;
      if ((psVar4 != (sStkNN *)0x0) && ((this->m_stkStack).m_ownsMemory == true)) {
        btAlignedFreeInternal(psVar4);
      }
      (this->m_stkStack).m_ownsMemory = true;
      (this->m_stkStack).m_data = psVar9;
      (this->m_stkStack).m_capacity = 0x80;
    }
    (this->m_stkStack).m_size = 0x80;
    psVar9 = (this->m_stkStack).m_data;
    psVar9->a = root0;
    psVar9->b = root1;
    iVar14 = 1;
    iVar16 = 0x7c;
    do {
      lVar12 = (long)iVar14;
      iVar15 = iVar14 + -1;
      lVar10 = lVar12 + -1;
      psVar9 = (this->m_stkStack).m_data;
      pbVar5 = psVar9[lVar10].a;
      pbVar6 = psVar9[lVar10].b;
      if (iVar16 < iVar15) {
        iVar3 = (this->m_stkStack).m_size;
        iVar16 = iVar3 * 2;
        if ((iVar3 < iVar16) && ((this->m_stkStack).m_capacity < iVar16)) {
          if (iVar3 == 0) {
            psVar9 = (sStkNN *)0x0;
          }
          else {
            psVar9 = (sStkNN *)btAlignedAllocInternal((long)iVar3 << 5,0x10);
            lVar11 = (long)(this->m_stkStack).m_size;
            if (0 < lVar11) {
              lVar13 = 0;
              do {
                puVar1 = (undefined8 *)((long)&((this->m_stkStack).m_data)->a + lVar13);
                uVar8 = puVar1[1];
                puVar2 = (undefined8 *)((long)&psVar9->a + lVar13);
                *puVar2 = *puVar1;
                puVar2[1] = uVar8;
                lVar13 = lVar13 + 0x10;
              } while (lVar11 * 0x10 != lVar13);
            }
          }
          psVar4 = (this->m_stkStack).m_data;
          if ((psVar4 != (sStkNN *)0x0) && ((this->m_stkStack).m_ownsMemory == true)) {
            btAlignedFreeInternal(psVar4);
          }
          (this->m_stkStack).m_ownsMemory = true;
          (this->m_stkStack).m_data = psVar9;
          (this->m_stkStack).m_capacity = iVar16;
        }
        (this->m_stkStack).m_size = iVar16;
        iVar16 = iVar16 + -4;
      }
      if (pbVar5 == pbVar6) {
        if ((pbVar5->field_2).childs[1] != (btDbvtNode *)0x0) {
          pbVar6 = (pbVar5->field_2).childs[0];
          psVar9 = (this->m_stkStack).m_data;
          psVar9[lVar10].a = pbVar6;
          psVar9[lVar10].b = pbVar6;
          pbVar6 = (pbVar5->field_2).childs[1];
          psVar9 = (this->m_stkStack).m_data;
          psVar9[lVar12].a = pbVar6;
          psVar9[lVar12].b = pbVar6;
          pbVar6 = (pbVar5->field_2).childs[1];
          psVar9 = (this->m_stkStack).m_data + lVar12 + 1;
          psVar9->a = (pbVar5->field_2).childs[0];
          psVar9->b = pbVar6;
          iVar15 = iVar14 + 2;
        }
      }
      else if (((((pbVar5->volume).mi.m_floats[0] <= (pbVar6->volume).mx.m_floats[0]) &&
                ((pbVar6->volume).mi.m_floats[0] <= (pbVar5->volume).mx.m_floats[0])) &&
               ((pbVar5->volume).mi.m_floats[1] <= (pbVar6->volume).mx.m_floats[1])) &&
              ((((pbVar6->volume).mi.m_floats[1] <= (pbVar5->volume).mx.m_floats[1] &&
                ((pbVar5->volume).mi.m_floats[2] <= (pbVar6->volume).mx.m_floats[2])) &&
               ((pbVar6->volume).mi.m_floats[2] <= (pbVar5->volume).mx.m_floats[2])))) {
        if ((pbVar5->field_2).childs[1] == (btDbvtNode *)0x0) {
          if ((pbVar6->field_2).childs[1] == (btDbvtNode *)0x0) {
            (*policy->_vptr_ICollide[2])(policy,pbVar5);
          }
          else {
            pbVar7 = (pbVar6->field_2).childs[0];
            psVar9 = (this->m_stkStack).m_data;
            psVar9[lVar10].a = pbVar5;
            psVar9[lVar10].b = pbVar7;
            pbVar6 = (pbVar6->field_2).childs[1];
            psVar9 = (this->m_stkStack).m_data;
            psVar9[lVar12].a = pbVar5;
            psVar9[lVar12].b = pbVar6;
            iVar15 = iVar14 + 1;
          }
        }
        else if ((pbVar6->field_2).childs[1] == (btDbvtNode *)0x0) {
          psVar9 = (this->m_stkStack).m_data;
          psVar9[lVar10].a = (pbVar5->field_2).childs[0];
          psVar9[lVar10].b = pbVar6;
          psVar9 = (this->m_stkStack).m_data;
          psVar9[lVar12].a = (pbVar5->field_2).childs[1];
          psVar9[lVar12].b = pbVar6;
          iVar15 = iVar14 + 1;
        }
        else {
          pbVar7 = (pbVar6->field_2).childs[0];
          psVar9 = (this->m_stkStack).m_data;
          psVar9[lVar10].a = (pbVar5->field_2).childs[0];
          psVar9[lVar10].b = pbVar7;
          pbVar7 = (pbVar6->field_2).childs[0];
          psVar9 = (this->m_stkStack).m_data;
          psVar9[lVar12].a = (pbVar5->field_2).childs[1];
          psVar9[lVar12].b = pbVar7;
          pbVar7 = (pbVar6->field_2).childs[1];
          psVar9 = (this->m_stkStack).m_data;
          psVar9[lVar12 + 1].a = (pbVar5->field_2).childs[0];
          psVar9[lVar12 + 1].b = pbVar7;
          pbVar6 = (pbVar6->field_2).childs[1];
          psVar9 = (this->m_stkStack).m_data;
          psVar9[lVar12 + 2].a = (pbVar5->field_2).childs[1];
          psVar9[lVar12 + 2].b = pbVar6;
          iVar15 = iVar14 + 3;
        }
      }
      iVar14 = iVar15;
    } while (iVar14 != 0);
  }
  return;
}

Assistant:

DBVT_PREFIX
inline void		btDbvt::collideTTpersistentStack(	const btDbvtNode* root0,
								  const btDbvtNode* root1,
								  DBVT_IPOLICY)
{
	DBVT_CHECKTYPE
		if(root0&&root1)
		{
			int								depth=1;
			int								treshold=DOUBLE_STACKSIZE-4;
			
			m_stkStack.resize(DOUBLE_STACKSIZE);
			m_stkStack[0]=sStkNN(root0,root1);
			do	{		
				sStkNN	p=m_stkStack[--depth];
				if(depth>treshold)
				{
					m_stkStack.resize(m_stkStack.size()*2);
					treshold=m_stkStack.size()-4;
				}
				if(p.a==p.b)
				{
					if(p.a->isinternal())
					{
						m_stkStack[depth++]=sStkNN(p.a->childs[0],p.a->childs[0]);
						m_stkStack[depth++]=sStkNN(p.a->childs[1],p.a->childs[1]);
						m_stkStack[depth++]=sStkNN(p.a->childs[0],p.a->childs[1]);
					}
				}
				else if(Intersect(p.a->volume,p.b->volume))
				{
					if(p.a->isinternal())
					{
						if(p.b->isinternal())
						{
							m_stkStack[depth++]=sStkNN(p.a->childs[0],p.b->childs[0]);
							m_stkStack[depth++]=sStkNN(p.a->childs[1],p.b->childs[0]);
							m_stkStack[depth++]=sStkNN(p.a->childs[0],p.b->childs[1]);
							m_stkStack[depth++]=sStkNN(p.a->childs[1],p.b->childs[1]);
						}
						else
						{
							m_stkStack[depth++]=sStkNN(p.a->childs[0],p.b);
							m_stkStack[depth++]=sStkNN(p.a->childs[1],p.b);
						}
					}
					else
					{
						if(p.b->isinternal())
						{
							m_stkStack[depth++]=sStkNN(p.a,p.b->childs[0]);
							m_stkStack[depth++]=sStkNN(p.a,p.b->childs[1]);
						}
						else
						{
							policy.Process(p.a,p.b);
						}
					}
				}
			} while(depth);
		}
}